

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XLinkStream.cpp
# Opt level: O3

XLinkStream * __thiscall dai::XLinkStream::operator=(XLinkStream *this,XLinkStream *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  streamId_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __old_val;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (this != other) {
    peVar3 = (other->connection).
             super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (other->connection).
             super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (other->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (other->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->connection).
              super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (this->connection).super___shared_ptr<dai::XLinkConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    sVar2 = other->streamId;
    other->streamId = 0xdeaddead;
    this->streamId = sVar2;
    local_40 = 0;
    local_38 = 0;
    local_68 = (size_type *)(other->streamName)._M_dataplus._M_p;
    paVar1 = &(other->streamName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68 == paVar1) {
      local_58 = paVar1->_M_allocated_capacity;
      uStack_50 = *(undefined8 *)((long)&(other->streamName).field_2 + 8);
      local_68 = &local_58;
    }
    else {
      local_58 = paVar1->_M_allocated_capacity;
    }
    local_60 = (other->streamName)._M_string_length;
    (other->streamName)._M_dataplus._M_p = (pointer)paVar1;
    (other->streamName)._M_string_length = 0;
    (other->streamName).field_2._M_local_buf[0] = '\0';
    local_48 = &local_38;
    ::std::__cxx11::string::operator=((string *)&other->streamName,(string *)&local_48);
    ::std::__cxx11::string::operator=((string *)&this->streamName,(string *)&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return this;
}

Assistant:

XLinkStream& XLinkStream::operator=(XLinkStream&& other) {
    if(this != &other) {
        connection = std::move(other.connection);
        streamId = std::exchange(other.streamId, INVALID_STREAM_ID);
        streamName = std::exchange(other.streamName, {});
    }
    return *this;
}